

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StateSpaceFilter.cpp
# Opt level: O0

double __thiscall
rtb::Filter::StateSpaceFilter<double>::filter
          (StateSpaceFilter<double> *this,double value,double time,double f0)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double yd;
  double y;
  double F;
  double E;
  double D;
  double C;
  double B;
  double A;
  double denom;
  double b;
  double a;
  double h;
  double f0_local;
  double time_local;
  double value_local;
  StateSpaceFilter<double> *this_local;
  
  if (this->lastTime_ <= time) {
    dVar1 = time - this->lastTime_;
    dVar2 = f0 * 6.283185307179586 * f0 * 6.283185307179586;
    dVar3 = sqrt(2.0);
    dVar3 = dVar3 * 2.0 * 3.141592653589793 * f0;
    dVar4 = dVar1 * dVar1 * dVar2 + dVar1 * 2.0 * dVar3 + 4.0;
    dVar5 = ((dVar1 * -4.0 * dVar2) / dVar4) * this->lastValue_ +
            ((-(dVar1 * dVar1) * dVar2 + -(dVar1 * 2.0) * dVar3 + 4.0) / dVar4) *
            this->lastFirstDerivative_ +
            (((dVar1 * 4.0 * dVar2) / dVar4) * (value + this->lastValue_)) / 2.0;
    this->lastSecondDerivative_ = (dVar5 - this->lastFirstDerivative_) / dVar1;
    this->lastValue_ =
         ((-(dVar1 * dVar1) * dVar2 + dVar1 * 2.0 * dVar3 + 4.0) / dVar4) * this->lastValue_ +
         ((dVar1 * 4.0) / dVar4) * this->lastFirstDerivative_ +
         (((dVar1 * 2.0 * dVar1 * dVar2) / dVar4) * (value + this->lastValue_)) / 2.0;
    this->lastFirstDerivative_ = dVar5;
  }
  else {
    this->lastValue_ = value;
    this->lastFirstDerivative_ = 0.0;
    this->lastSecondDerivative_ = 0.0;
  }
  this->lastTime_ = time;
  return this->lastValue_;
}

Assistant:

T StateSpaceFilter<T>::filter(T value, double time, double f0) {

            if (time < lastTime_)
            {
                lastValue_ = value;
                lastFirstDerivative_ = 0.0;
                lastSecondDerivative_ = 0.0;
            }
            else
            {
                double h = time - lastTime_;
                double a = (2 * M_PI * f0) * (2 * M_PI * f0);
                double b = sqrt(2) * 2 * M_PI * f0;
                double denom = 4 + 2 * h * b + h * h * a;
                double A = (4 + 2 * h*b - h * h * a) / denom;
                double B = 4 * h / denom;
                double C = -4 * h*a / denom;
                double D = (4 - 2 * h * b - h * h * a) / denom;
                double E = 2 * h * h * a / denom;
                double F = 4 * h*a / denom;
                double y = A*lastValue_ + B*lastFirstDerivative_ + E*(value + lastValue_) / 2;
                double yd = C*lastValue_ + D*lastFirstDerivative_ + F*(value + lastValue_) / 2;
                lastSecondDerivative_ = (yd - lastFirstDerivative_) / h;

                lastValue_ = y;
                lastFirstDerivative_ = yd;
            }
            lastTime_ = time;
            return lastValue_;
        }